

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::MultipartFormDataParser::set_boundary
          (MultipartFormDataParser *this,string *boundary)

{
  string *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_80 [48];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x40);
  ::std::__cxx11::string::operator=((string *)__lhs,in_RSI);
  ::std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ::std::operator+(__lhs,in_stack_ffffffffffffff40);
  ::std::__cxx11::string::operator=((string *)(in_RDI + 0x60),local_30);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_50);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff60;
  ::std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ::std::operator+(__lhs,__rhs);
  ::std::__cxx11::string::operator=((string *)(in_RDI + 0x80),local_80);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  return;
}

Assistant:

void set_boundary(std::string &&boundary) {
    boundary_ = boundary;
    dash_boundary_crlf_ = dash_ + boundary_ + crlf_;
    crlf_dash_boundary_ = crlf_ + dash_ + boundary_;
  }